

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O3

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  ulong uVar1;
  size_t outlen;
  size_t outlen_00;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  secp256k1_scalar diff;
  uchar nonce32 [32];
  secp256k1_scalar b;
  secp256k1_gej gb;
  uchar keydata [64];
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_scalar local_1c8;
  uchar local_1a8 [32];
  secp256k1_scalar local_188;
  undefined1 local_168 [16];
  uint64_t uStack_158;
  undefined1 local_150 [16];
  secp256k1_gej local_138;
  uchar local_b8 [32];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  secp256k1_rfc6979_hmac_sha256 local_78;
  
  secp256k1_scalar_half((secp256k1_scalar *)&local_138,&secp256k1_scalar_one);
  secp256k1_scalar_negate((secp256k1_scalar *)&local_138,(secp256k1_scalar *)&local_138);
  local_1c8.d[2] = 0;
  local_1c8.d[3] = 0;
  local_1c8.d[0] = 1;
  local_1c8.d[1] = 0;
  iVar2 = 0x101;
  do {
    secp256k1_scalar_add(&local_1c8,&local_1c8,&local_1c8);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  secp256k1_scalar_add(&local_1c8,&local_1c8,(secp256k1_scalar *)&local_138);
  if (seed32 == (uchar *)0x0) {
    secp256k1_ge_neg(&ctx->ge_offset,&secp256k1_ge_const_g);
    secp256k1_scalar_add(&ctx->scalar_offset,&secp256k1_scalar_one,&local_1c8);
    (ctx->proj_blind).n[2] = 0;
    (ctx->proj_blind).n[3] = 0;
    (ctx->proj_blind).n[0] = 1;
    (ctx->proj_blind).n[1] = 0;
    (ctx->proj_blind).n[4] = 0;
  }
  else {
    secp256k1_scalar_get_b32(local_b8,&ctx->scalar_offset);
    local_98 = *(undefined8 *)seed32;
    uStack_90 = *(undefined8 *)(seed32 + 8);
    local_88 = *(undefined8 *)(seed32 + 0x10);
    uStack_80 = *(undefined8 *)(seed32 + 0x18);
    secp256k1_rfc6979_hmac_sha256_initialize(&local_78,local_b8,0x40);
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    secp256k1_rfc6979_hmac_sha256_generate(&local_78,local_1a8,outlen);
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)local_168,local_1a8);
    local_138.x.n[0]._0_4_ = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)local_168);
    uVar1 = (long)(int)(uint)local_138.x.n[0] - 1;
    local_168._0_8_ = (ulong)((uint)local_138.x.n[0] & 1) | uVar1 & local_168._0_8_;
    auVar4._8_4_ = (int)uVar1;
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = (int)(uVar1 >> 0x20);
    register0x00001240 = stack0xfffffffffffffea0 & auVar4;
    local_150 = local_150 & auVar4;
    (ctx->proj_blind).n[4] = local_150._8_8_;
    (ctx->proj_blind).n[2] = uStack_158;
    (ctx->proj_blind).n[3] = local_150._0_8_;
    (ctx->proj_blind).n[0] = local_168._0_8_;
    (ctx->proj_blind).n[1] = local_168._8_8_;
    secp256k1_rfc6979_hmac_sha256_generate(&local_78,local_1a8,outlen_00);
    secp256k1_scalar_set_b32(&local_188,local_1a8,(int *)0x0);
    uVar3 = (uint)(((local_188.d[1] == 0 && local_188.d[0] == 0) && local_188.d[2] == 0) &&
                  local_188.d[3] == 0);
    local_138.x.n[0] = CONCAT44(local_138.x.n[0]._4_4_,uVar3);
    uVar1 = (long)(int)uVar3 - 1;
    local_188.d[0] = (ulong)uVar3 | local_188.d[0] & uVar1;
    local_188.d[1] = local_188.d[1] & uVar1;
    local_188.d[2] = local_188.d[2] & uVar1;
    local_188.d[3] = uVar1 & local_188.d[3];
    secp256k1_ecmult_gen(ctx,&local_138,&local_188);
    secp256k1_scalar_negate(&local_188,&local_188);
    secp256k1_scalar_add(&ctx->scalar_offset,&local_188,&local_1c8);
    secp256k1_ge_set_gej(&ctx->ge_offset,&local_138);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_scalar diff;
    secp256k1_gej gb;
    secp256k1_fe f;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];

    /* Compute the (2^COMB_BITS - 1)/2 term once. */
    secp256k1_ecmult_gen_scalar_diff(&diff);

    if (seed32 == NULL) {
        /* When seed is NULL, reset the final point and blinding value. */
        secp256k1_ge_neg(&ctx->ge_offset, &secp256k1_ge_const_g);
        secp256k1_scalar_add(&ctx->scalar_offset, &secp256k1_scalar_one, &diff);
        ctx->proj_blind = secp256k1_fe_one;
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->scalar_offset);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    secp256k1_memclear(keydata, sizeof(keydata));

    /* Compute projective blinding factor (cannot be 0). */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&f, nonce32);
    secp256k1_fe_cmov(&f, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&f));
    ctx->proj_blind = f;

    /* For a random blinding value b, set scalar_offset=diff-b, ge_offset=bG */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* The blinding value cannot be zero, as that would mean ge_offset = infinity,
     * which secp256k1_gej_add_ge cannot handle. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    secp256k1_scalar_add(&ctx->scalar_offset, &b, &diff);
    secp256k1_ge_set_gej(&ctx->ge_offset, &gb);

    /* Clean up. */
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
    secp256k1_fe_clear(&f);
    secp256k1_rfc6979_hmac_sha256_clear(&rng);
}